

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseCodeTree.cpp
# Opt level: O0

Clause * __thiscall
Indexing::ClauseCodeTree::ClauseMatcher::next(ClauseMatcher *this,int *resolvedQueryLit)

{
  bool bVar1;
  undefined1 uVar2;
  LiteralMatcher *cl;
  ILStruct *pIVar3;
  size_t sVar4;
  ClauseMatcher *in_RSI;
  undefined8 *in_RDI;
  bool seekOnlySuccess;
  CodeOp *newLitEntry;
  Clause *candidate;
  bool found;
  LiteralMatcher *lm;
  LiteralMatcher *in_stack_ffffffffffffffa8;
  CodeOp *in_stack_ffffffffffffffb0;
  Clause *in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd8;
  Clause *local_8;
  
  bVar1 = Lib::
          Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
          ::isEmpty((Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
                     *)(in_RDI + 6));
  if (bVar1) {
    local_8 = (Clause *)0x0;
  }
  else {
    do {
      while( true ) {
        while( true ) {
          Lib::
          Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
          ::top((Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
                 *)(in_RDI + 6));
          cl = Lib::
               Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
               ::operator*((Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
                            *)0x2f6fed);
          uVar2 = LiteralMatcher::next(in_stack_ffffffffffffffa8);
          if ((bool)uVar2) break;
          leaveLiteral((ClauseMatcher *)in_stack_ffffffffffffffd0);
          bVar1 = Lib::
                  Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
                  ::isEmpty((Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
                             *)(in_RDI + 6));
          if (bVar1) {
            return (Clause *)0x0;
          }
        }
        bVar1 = CodeTree::CodeOp::isSuccess(in_stack_ffffffffffffffb0);
        if (bVar1) break;
        bVar1 = canEnterLiteral(in_RSI,(CodeOp *)cl);
        if (bVar1) {
          if ((((*(byte *)(in_RDI + 2) & 1) != 0) && (*(int *)((long)in_RDI + 0x14) == -1)) &&
             (pIVar3 = LiteralMatcher::getILS((LiteralMatcher *)0x2f70d9),
             (pIVar3->noNonOppositeMatches & 1U) != 0)) {
            sVar4 = Lib::
                    Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
                    ::size((Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
                            *)(in_RDI + 6));
            *(int *)((long)in_RDI + 0x14) = (int)sVar4 + -1;
          }
          in_stack_ffffffffffffffb0 =
               (CodeOp *)
               Lib::
               Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
               ::size((Stack<Lib::Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
                       *)(in_RDI + 6));
          Kernel::Clause::length((Clause *)*in_RDI);
          enterLiteral((ClauseMatcher *)resolvedQueryLit,(CodeOp *)lm,found);
        }
      }
      in_stack_ffffffffffffffd0 =
           CodeTree::CodeOp::getSuccessResult<Kernel::Clause>((CodeOp *)0x2f705a);
      bVar1 = checkCandidate(in_RSI,(Clause *)cl,(int *)CONCAT17(uVar2,in_stack_ffffffffffffffd8));
      local_8 = in_stack_ffffffffffffffd0;
    } while (!bVar1);
  }
  return local_8;
}

Assistant:

Clause* ClauseCodeTree::ClauseMatcher::next(int& resolvedQueryLit)
{
  if(lms.isEmpty()) {
    return 0;
  }

  for(;;) {
    LiteralMatcher* lm = &*lms.top();

    //get next literal from the literal matcher
    bool found=lm->next();

    //if there's none, go one level up (or fail if at the top)
    if(!found) {
      leaveLiteral();
      if(lms.isEmpty()) {
	return 0;
      }
    }
    else if(lm->op->isSuccess()) {
      Clause* candidate=lm->op->getSuccessResult<Clause>();
      RSTAT_MCTR_INC("candidates", lms.size()-1);
      if(checkCandidate(candidate, resolvedQueryLit)) {
	RSTAT_MCTR_INC("candidates (success)", lms.size()-1);
	return candidate;
      }
    }
    else if(canEnterLiteral(lm->op)) {
      ASS(lm->op->isLitEnd());
      ASS_LE(lms.size(), query->length()); //this is due to the seekOnlySuccess part below

      //LIT_END is never the last operation in the CodeBlock,
      //so we can increase here
      CodeOp* newLitEntry=lm->op+1;

      //check that we have cleared the sresLiteral value if it is no longer valid
      ASS(!sres || sresLiteral==sresNoLiteral || sresLiteral<lms.size()-1);

      if(sres && sresLiteral==sresNoLiteral) {
	//we check whether we haven't matched only opposite literals on the previous level
	if(lm->getILS()->noNonOppositeMatches) {
	  sresLiteral=lms.size()-1;
	}
      }

      bool seekOnlySuccess=lms.size()==query->length();
      enterLiteral(newLitEntry, seekOnlySuccess);
    }
  }
}